

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workspace.c
# Opt level: O2

void workspace_list_destroy(workspace_list *workspace_list)

{
  workspace *workspace;
  size_t i;
  ulong uVar1;
  
  if (workspace_list->theme != (theme *)0x0) {
    theme_destroy(workspace_list->theme);
  }
  map_destroy(workspace_list->client_map);
  for (uVar1 = 0; uVar1 < workspace_list->count; uVar1 = uVar1 + 1) {
    workspace = workspace_list->workspaces[uVar1];
    if (workspace != (workspace *)0x0) {
      workspace_destroy(workspace);
    }
  }
  free(workspace_list->workspaces);
  free(workspace_list);
  return;
}

Assistant:

void workspace_list_destroy(struct workspace_list *workspace_list)
{
        if (workspace_list->theme != NULL) {
                theme_destroy(workspace_list->theme);
        }

        map_destroy(workspace_list->client_map);

        for (size_t i = 0; i < workspace_list->count; ++i) {
                if (workspace_list->workspaces[i] != NULL) {
                        workspace_destroy(workspace_list->workspaces[i]);
                }
        }

        free(workspace_list->workspaces);
        free(workspace_list);
}